

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobuf.c
# Opt level: O0

int abuf_strftime(autobuf *autobuf,char *format,tm *tm)

{
  size_t sVar1;
  int iVar2;
  size_t local_30;
  size_t rc;
  tm *tm_local;
  char *format_local;
  autobuf *autobuf_local;
  
  if (autobuf == (autobuf *)0x0) {
    return 0;
  }
  local_30 = strftime(autobuf->_buf + autobuf->_len,autobuf->_total - autobuf->_len,format,(tm *)tm)
  ;
  if (local_30 == 0) {
    sVar1 = autobuf->_total;
    iVar2 = getpagesize();
    iVar2 = _autobuf_enlarge(autobuf,sVar1 + (long)iVar2);
    if (iVar2 < 0) {
      autobuf->_buf[autobuf->_len] = '\0';
      return -1;
    }
    local_30 = strftime(autobuf->_buf + autobuf->_len,autobuf->_total - autobuf->_len,format,
                        (tm *)tm);
    if (local_30 == 0) {
      autobuf->_buf[autobuf->_len] = '\0';
      return -1;
    }
  }
  autobuf->_len = local_30 + autobuf->_len;
  return (int)local_30;
}

Assistant:

int
abuf_strftime(struct autobuf *autobuf, const char *format, const struct tm *tm) {
  size_t rc;

  if (autobuf == NULL)
    return 0;

  rc = strftime(autobuf->_buf + autobuf->_len, autobuf->_total - autobuf->_len, format, tm);
  if (rc == 0) {
    /* we had an error! Probably the buffer too small. So we add some bytes. */
    if (_autobuf_enlarge(autobuf, autobuf->_total + getpagesize()) < 0) {
      autobuf->_buf[autobuf->_len] = '\0';
      return -1;
    }

    rc = strftime(autobuf->_buf + autobuf->_len, autobuf->_total - autobuf->_len, format, tm);
    if (rc == 0) {
      /* make sure we are null-terminated */
      autobuf->_buf[autobuf->_len] = 0;

      return -1;
    }
  }

  /* add data to length field */
  autobuf->_len += rc;
  return rc;
}